

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultTheme.cpp
# Opt level: O3

shared_ptr<gui::ChatBoxStyle> __thiscall gui::DefaultTheme::makeChatBoxStyle(DefaultTheme *this)

{
  Gui *__args;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<gui::ChatBoxStyle> sVar1;
  undefined1 local_29;
  Vector3f local_28;
  
  __args = *(Gui **)(in_RSI + 8);
  (this->super_Theme)._vptr_Theme = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<gui::ChatBoxStyle,std::allocator<gui::ChatBoxStyle>,gui::Gui_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->super_Theme).gui_,
             (ChatBoxStyle **)this,(allocator<gui::ChatBoxStyle> *)&local_29,__args);
  ChatBoxStyle::setFillColor
            ((ChatBoxStyle *)(this->super_Theme)._vptr_Theme,(Color *)&sf::Color::White);
  ChatBoxStyle::setOutlineColor
            ((ChatBoxStyle *)(this->super_Theme)._vptr_Theme,
             (Color *)&(anonymous_namespace)::colorGray);
  ChatBoxStyle::setOutlineThickness((ChatBoxStyle *)(this->super_Theme)._vptr_Theme,-1.0);
  ChatBoxStyle::setFont((ChatBoxStyle *)(this->super_Theme)._vptr_Theme,*(Font **)(in_RSI + 0x48));
  ChatBoxStyle::setCharacterSize((ChatBoxStyle *)(this->super_Theme)._vptr_Theme,0xf);
  ChatBoxStyle::setTextFillColor
            ((ChatBoxStyle *)(this->super_Theme)._vptr_Theme,
             (Color *)&(anonymous_namespace)::colorGray2);
  ChatBoxStyle::setInvertedTextFillColor
            ((ChatBoxStyle *)(this->super_Theme)._vptr_Theme,(Color *)&sf::Color::Black);
  ChatBoxStyle::setHighlightFillColor
            ((ChatBoxStyle *)(this->super_Theme)._vptr_Theme,
             (Color *)&(anonymous_namespace)::colorLightBlueTransparent);
  local_28.z = *(float *)(in_RSI + 0x50);
  local_28.x = 8.0;
  local_28.y = 1.0;
  ChatBoxStyle::setTextPadding((ChatBoxStyle *)(this->super_Theme)._vptr_Theme,&local_28);
  sVar1.super___shared_ptr<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<gui::ChatBoxStyle>)
         sVar1.super___shared_ptr<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChatBoxStyle> DefaultTheme::makeChatBoxStyle() const {
    auto style = std::make_shared<ChatBoxStyle>(gui_);
    style->setFillColor(sf::Color::White);
    style->setOutlineColor(colorGray);
    style->setOutlineThickness(-1.0f);

    style->setFont(*font_);
    style->setCharacterSize(15);
    style->setTextFillColor(colorGray2);

    style->setInvertedTextFillColor(sf::Color::Black);
    style->setHighlightFillColor(colorLightBlueTransparent);
    style->setTextPadding({8.0f, 1.0f, fontMaxHeightRatio_});

    return style;
}